

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall BinaryExpression::restoreXml(BinaryExpression *this,Element *el,Translate *trans)

{
  reference ppEVar1;
  PatternExpression *pPVar2;
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_> local_30;
  const_iterator iter;
  List *list;
  Translate *trans_local;
  Element *el_local;
  BinaryExpression *this_local;
  
  iter._M_current = (Element **)Element::getChildren(el);
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  __normal_iterator(&local_30);
  local_30._M_current =
       (Element **)std::vector<Element_*,_std::allocator<Element_*>_>::begin(iter._M_current);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  pPVar2 = PatternExpression::restoreExpression(*ppEVar1,trans);
  this->left = pPVar2;
  __gnu_cxx::
  __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>::
  operator++(&local_30);
  ppEVar1 = __gnu_cxx::
            __normal_iterator<Element_*const_*,_std::vector<Element_*,_std::allocator<Element_*>_>_>
            ::operator*(&local_30);
  pPVar2 = PatternExpression::restoreExpression(*ppEVar1,trans);
  this->right = pPVar2;
  PatternExpression::layClaim(this->left);
  PatternExpression::layClaim(this->right);
  return;
}

Assistant:

void BinaryExpression::restoreXml(const Element *el,Translate *trans)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  left = PatternExpression::restoreExpression(*iter,trans);
  ++iter;
  right = PatternExpression::restoreExpression(*iter,trans);
  left->layClaim();
  right->layClaim();
}